

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::
SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>::
emplaceRealloc<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
          (SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
           *this,pointer pos,
          unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *args)

{
  ulong uVar1;
  long lVar2;
  ulong *puVar3;
  pointer puVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  Lexer *pLVar7;
  Lexer *ctx;
  long lVar8;
  
  if (*(long *)(this + 8) == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  pLVar7 = (Lexer *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (Lexer *)(uVar1 * 2);
  if (pLVar7 < ctx) {
    pLVar7 = ctx;
  }
  if (0xfffffffffffffff - uVar1 < uVar1) {
    pLVar7 = (Lexer *)0xfffffffffffffff;
  }
  lVar8 = (long)pos - *(long *)this;
  puVar3 = (ulong *)operator_new((long)pLVar7 * 8);
  *(Lexer **)((long)puVar3 + lVar8) =
       (args->_M_t).
       super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
       _M_t.
       super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
       super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
  (args->_M_t).
  super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>._M_t.
  super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
  super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
  puVar4 = *(pointer *)this;
  lVar2 = *(long *)(this + 8);
  if (puVar4 + lVar2 == pos) {
    puVar6 = puVar3;
    if (lVar2 != 0) {
      do {
        *puVar6 = (ulong)(puVar4->_M_t).
                         super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                         .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
        (puVar4->_M_t).
        super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
        _M_t.
        super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
        .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
        puVar4 = puVar4 + 1;
        puVar6 = puVar6 + 1;
      } while (puVar4 != pos);
    }
  }
  else {
    puVar6 = puVar3;
    if (puVar4 != pos) {
      do {
        ctx = (puVar4->_M_t).
              super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
              .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
        *puVar6 = (ulong)ctx;
        (puVar4->_M_t).
        super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
        _M_t.
        super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
        .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
        puVar4 = puVar4 + 1;
        puVar6 = puVar6 + 1;
      } while (puVar4 != pos);
      puVar4 = *(pointer *)this;
    }
    if (puVar4 + lVar2 != pos) {
      puVar5 = (undefined8 *)(lVar8 + (long)puVar3);
      do {
        puVar5 = puVar5 + 1;
        *puVar5 = (pos->_M_t).
                  super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                  .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
        (pos->_M_t).
        super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
        _M_t.
        super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
        .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
        pos = pos + 1;
      } while (pos != puVar4 + lVar2);
    }
  }
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  ::cleanup((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
             *)this,(EVP_PKEY_CTX *)ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(Lexer **)(this + 0x10) = pLVar7;
  *(ulong **)this = puVar3;
  return (pointer)((long)puVar3 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}